

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O1

void __thiscall Assimp::FileSystemFilter::BuildPath(FileSystemFilter *this,string *in)

{
  IOSystem *pIVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pIVar1 = this->mWrapped;
  if (pIVar1 == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/FileSystemFilter.h"
                  ,0xe1,"void Assimp::FileSystemFilter::BuildPath(std::string &) const");
  }
  if ((2 < in->_M_string_length) &&
     (iVar2 = (*pIVar1->_vptr_IOSystem[2])(pIVar1,(in->_M_dataplus)._M_p), (char)iVar2 == '\0')) {
    if ((in->_M_dataplus)._M_p[1] != ':') {
      std::operator+(&local_78,&this->mBase,in);
      iVar2 = (*this->mWrapped->_vptr_IOSystem[2])(this->mWrapped,local_78._M_dataplus._M_p);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::_M_assign((string *)in);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((char)iVar2 != '\0') {
        return;
      }
    }
    cVar4 = (char)in;
    local_58 = std::__cxx11::string::rfind(cVar4,0x2f);
    if (local_58 == -1) {
      local_58 = std::__cxx11::string::rfind(cVar4,0x5c);
    }
    if (local_58 != -1) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      do {
        std::__cxx11::string::_M_assign((string *)&local_78);
        std::__cxx11::string::push_back((char)&local_78);
        lVar3 = std::__cxx11::string::rfind(cVar4,0x2f);
        if (lVar3 == -1) {
          lVar3 = std::__cxx11::string::rfind(cVar4,0x5c);
        }
        if (lVar3 + 1U < 2) {
          bVar5 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)local_50,(ulong)in);
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50[0]);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          iVar2 = (*this->mWrapped->_vptr_IOSystem[2])(this->mWrapped,local_78._M_dataplus._M_p);
          bVar5 = (char)iVar2 == '\0';
          if (!bVar5) {
            std::__cxx11::string::_M_assign((string *)in);
          }
        }
      } while (bVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void BuildPath (std::string& in) const {
        ai_assert( nullptr != mWrapped );
        // if we can already access the file, great.
        if (in.length() < 3 || mWrapped->Exists(in)) {
            return;
        }

        // Determine whether this is a relative path (Windows-specific - most assets are packaged on Windows).
        if (in[1] != ':') {

            // append base path and try
            const std::string tmp = mBase + in;
            if (mWrapped->Exists(tmp)) {
                in = tmp;
                return;
            }
        }

        // Chop of the file name and look in the model directory, if
        // this fails try all sub paths of the given path, i.e.
        // if the given path is foo/bar/something.lwo, try
        // <base>/something.lwo
        // <base>/bar/something.lwo
        // <base>/foo/bar/something.lwo
        std::string::size_type pos = in.rfind('/');
        if (std::string::npos == pos) {
            pos = in.rfind('\\');
        }

        if (std::string::npos != pos)   {
            std::string tmp;
            std::string::size_type last_dirsep = std::string::npos;

            while(true) {
                tmp = mBase;
                tmp += mSep;

                std::string::size_type dirsep = in.rfind('/', last_dirsep);
                if (std::string::npos == dirsep) {
                    dirsep = in.rfind('\\', last_dirsep);
                }

                if (std::string::npos == dirsep || dirsep == 0) {
                    // we did try this already.
                    break;
                }

                last_dirsep = dirsep-1;

                tmp += in.substr(dirsep+1, in.length()-pos);
                if (mWrapped->Exists(tmp)) {
                    in = tmp;
                    return;
                }
            }
        }

        // hopefully the underlying file system has another few tricks to access this file ...
    }